

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Error initializeEncoding(XML_Parser parser)

{
  int iVar1;
  XML_Error XVar2;
  code *pcVar3;
  
  if (*(int *)((long)parser + 0x1c8) == 0) {
    pcVar3 = cm_expat_XmlInitEncoding;
  }
  else {
    pcVar3 = cm_expat_XmlInitEncodingNS;
  }
  iVar1 = (*pcVar3)((long)parser + 0x120,(long)parser + 0x118,*(undefined8 *)((long)parser + 0x1c0))
  ;
  if (iVar1 != 0) {
    return XML_ERROR_NONE;
  }
  XVar2 = handleUnknownEncoding(parser,*(XML_Char **)((long)parser + 0x1c0));
  return XVar2;
}

Assistant:

static enum XML_Error
initializeEncoding(XML_Parser parser)
{
  const char *s;
#ifdef XML_UNICODE
  char encodingBuf[128];
  if (!protocolEncodingName)
    s = 0;
  else {
    int i;
    for (i = 0; protocolEncodingName[i]; i++) {
      if (i == sizeof(encodingBuf) - 1
          || (protocolEncodingName[i] & ~0x7f) != 0) {
        encodingBuf[0] = '\0';
        break;
      }
      encodingBuf[i] = (char)protocolEncodingName[i];
    }
    encodingBuf[i] = '\0';
    s = encodingBuf;
  }
#else
  s = protocolEncodingName;
#endif
  if ((ns ? XmlInitEncodingNS : XmlInitEncoding)(&initEncoding, &encoding, s))
    return XML_ERROR_NONE;
  return handleUnknownEncoding(parser, protocolEncodingName);
}